

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void ym2608_reset_chip(void *chip)

{
  FM_OPN *OPN;
  double dVar1;
  byte bVar2;
  undefined2 *puVar3;
  uint uVar4;
  ulong uVar5;
  
  OPN = (FM_OPN *)((long)chip + 0x208);
  *(undefined1 *)((long)chip + 0x235) = 2;
  OPNSetPres(OPN,0x90,0x90,8);
  *(undefined8 *)((long)chip + 0x5388) = *(undefined8 *)((long)chip + 0x220);
  (**(code **)((long)chip + 0x670))(*(undefined8 *)((long)chip + 0x678));
  *(byte *)((long)chip + 0x208) = *(byte *)((long)chip + 0x208) & 0xfb;
  *(undefined1 *)((long)chip + 0x540a) = 0x1f;
  bVar2 = *(byte *)((long)chip + 0x5409) & 0x1f;
  *(byte *)((long)chip + 0x22e) = bVar2;
  if ((*(char *)((long)chip + 0x22d) == '\0') && ((bVar2 & *(byte *)((long)chip + 0x22f)) != 0)) {
    *(undefined1 *)((long)chip + 0x22d) = 1;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210));
    }
  }
  if ((*(char *)((long)chip + 0x22d) != '\0') &&
     ((*(byte *)((long)chip + 0x22f) & *(byte *)((long)chip + 0x22e)) == 0)) {
    *(undefined1 *)((long)chip + 0x22d) = 0;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210));
    }
  }
  *(undefined1 *)((long)chip + 0x5409) = 0xe3;
  bVar2 = *(byte *)((long)chip + 0x540a) & 0xe3;
  *(byte *)((long)chip + 0x22e) = bVar2;
  if ((*(char *)((long)chip + 0x22d) == '\0') && ((bVar2 & *(byte *)((long)chip + 0x22f)) != 0)) {
    *(undefined1 *)((long)chip + 0x22d) = 1;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210));
    }
  }
  if ((*(char *)((long)chip + 0x22d) != '\0') &&
     ((*(byte *)((long)chip + 0x22f) & *(byte *)((long)chip + 0x22e)) == 0)) {
    *(undefined1 *)((long)chip + 0x22d) = 0;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210));
    }
  }
  *(undefined8 *)((long)chip + 0x6d8) = 0;
  *(undefined4 *)((long)chip + 0x23c) = 0;
  *(undefined4 *)((long)chip + 0x244) = 0;
  *(undefined1 *)((long)chip + 0x69c) = 0;
  *(undefined1 *)((long)chip + 0x22f) = 0;
  *(undefined4 *)((long)chip + 0x230) = 0;
  *(undefined1 *)((long)chip + 0x22d) = 0;
  memset((void *)((long)chip + 8),0,0x200);
  reset_channels((FM_ST *)((long)chip + 0x210),(FM_CH *)((long)chip + 0x4778),6);
  uVar4 = 0xb7;
  do {
    uVar4 = uVar4 - 1;
    OPNWriteReg(OPN,uVar4,0xc0);
    OPNWriteReg(OPN,uVar4 | 0x100,0xc0);
  } while (0xb4 < uVar4);
  uVar4 = 0xb3;
  do {
    uVar4 = uVar4 - 1;
    OPNWriteReg(OPN,uVar4,0);
    OPNWriteReg(OPN,uVar4 | 0x100,0);
  } while (0x30 < uVar4);
  uVar4 = 0x27;
  OPNWriteMode(OPN,0x27,0x30);
  do {
    uVar4 = uVar4 - 1;
    OPNWriteReg(OPN,uVar4,0);
  } while (0x20 < uVar4);
  dVar1 = *(double *)((long)chip + 0x220);
  puVar3 = (undefined2 *)((long)chip + 0x5120);
  uVar5 = 0;
  do {
    *(int *)(puVar3 + 6) =
         (int)(long)((double)((float)dVar1 * 65536.0) /
                    *(double *)(&DAT_001742f0 + (ulong)(uVar5 < 4) * 8));
    *(undefined8 *)(puVar3 + 8) = *(undefined8 *)(YM2608_ADPCM_ROM_addr + uVar5 * 2);
    *(undefined8 *)(puVar3 + 2) = 0;
    *(undefined1 *)(puVar3 + 0x14) = 0;
    *(long *)(puVar3 + 0x18) = (long)chip + 0x4738;
    *puVar3 = 0;
    *(undefined8 *)(puVar3 + 0xe) = 0;
    *(undefined4 *)(puVar3 + 0x12) = 0;
    uVar5 = uVar5 + 1;
    puVar3 = puVar3 + 0x20;
  } while (uVar5 != 6);
  *(undefined1 *)((long)chip + 0x511c) = 0x3f;
  *(undefined1 *)((long)chip + 0x5360) = 0;
  *(undefined8 *)((long)chip + 0x5388) = *(undefined8 *)((long)chip + 0x220);
  YM_DELTAT_ADPCM_Reset((YM_DELTAT *)((long)chip + 0x5368),3);
  return;
}

Assistant:

void ym2608_reset_chip(void *chip)
{
	int i;
	YM2608 *F2608 = (YM2608 *)chip;
	FM_OPN *OPN   = &F2608->OPN;
	YM_DELTAT *DELTAT = &F2608->deltaT;

	/* Reset Prescaler */
	OPNPrescaler_w(OPN , 0 , 2);
	F2608->deltaT.freqbase = OPN->ST.freqbase;
	/* reset SSG section */
	OPN->ST.SSG_funcs.reset(OPN->ST.SSG_param);

	/* status clear */
	FM_BUSY_CLEAR(&OPN->ST);

	/* register 0x29 - default value after reset is:
		enable only 3 FM channels and enable all the status flags */
	YM2608IRQMaskWrite(OPN, F2608, 0x1f );  /* default value for D4-D0 is 1 */

	/* register 0x10, A1=1 - default value is 1 for D4, D3, D2, 0 for the rest */
	YM2608IRQFlagWrite(OPN, F2608, 0x1c );  /* default: enable timer A and B, disable EOS, BRDY and ZERO */

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;
	OPN->ST.irq = 0;

	memset(F2608->REGS, 0x00, sizeof(UINT8) * 512);

	reset_channels( &OPN->ST , F2608->CH , 6 );
	/* reset Operator paramater */
	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}
	OPNWriteMode(OPN,0x27,0x30); /* mode 0 , timer reset */
	for(i = 0x26 ; i >= 0x20 ; i-- ) OPNWriteReg(OPN,i,0);

	/* ADPCM - percussion sounds */
	for( i = 0; i < 6; i++ )
	{
		if (i<=3)   /* channels 0,1,2,3 */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/3.0);
		else        /* channels 4 and 5 work with slower clock */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/6.0);

		F2608->adpcm[i].start     = YM2608_ADPCM_ROM_addr[i*2];
		F2608->adpcm[i].end       = YM2608_ADPCM_ROM_addr[i*2+1];

		F2608->adpcm[i].now_addr  = 0;
		F2608->adpcm[i].now_step  = 0;
		// F2608->adpcm[i].delta     = 21866;
		F2608->adpcm[i].vol_mul   = 0;
		F2608->adpcm[i].pan       = &OPN->out_adpcm[OUTD_CENTER]; /* default center */
		F2608->adpcm[i].flagMask  = 0;
		F2608->adpcm[i].flag      = 0;
		F2608->adpcm[i].adpcm_acc = 0;
		F2608->adpcm[i].adpcm_step= 0;
		F2608->adpcm[i].adpcm_out = 0;
	}
	F2608->adpcmTL = 0x3f;

	F2608->adpcm_arrivedEndAddress = 0; /* not used */

	/* DELTA-T unit */
	DELTAT->freqbase = OPN->ST.freqbase;
	YM_DELTAT_ADPCM_Reset(DELTAT,OUTD_CENTER);
}